

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise1d.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise1D::forward
          (ConvolutionDepthWise1D *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int _kernel_w;
  Mat *bottom_blob;
  Mat *this_00;
  int *piVar1;
  int iVar2;
  undefined4 in_stack_fffffffffffffed8;
  int _h;
  Mat local_118;
  Mat local_c8;
  Mat local_78;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  _kernel_w = bottom_blob[1].w;
  _h = bottom_blob[1].c;
  local_78.cstep = 0;
  local_78.data = (Mat *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  flatten(bottom_blob + 1,&local_78,opt);
  iVar2 = -100;
  if (((Mat *)local_78.data == (Mat *)0x0) || ((long)local_78.c * local_78.cstep == 0))
  goto LAB_004ffb1e;
  local_118.cstep = 0;
  local_118.data = (void *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize._0_4_ = 0;
  local_118._20_8_ = 0;
  local_118.allocator = (Allocator *)0x0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.d = 0;
  local_118.c = 0;
  if (this->bias_term == 0) {
LAB_004ff9c1:
    local_c8.cstep = 0;
    local_c8.data = (void *)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.elemsize._0_4_ = 0;
    local_c8.elemsize._4_4_ = 0;
    local_c8.elempack = 0;
    local_c8.allocator = (Allocator *)0x0;
    local_c8.dims = 0;
    local_c8.w = 0;
    local_c8.h = 0;
    local_c8.d = 0;
    local_c8.c = 0;
    make_padding(this,bottom_blob,&local_c8,_kernel_w,opt);
    iVar2 = -100;
    if ((local_c8.data != (void *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
      Mat::create(this_00,(~((_kernel_w + -1) * this->dilation_w) + local_c8.w) / this->stride_w + 1
                  ,_h,CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize),
                  opt->blob_allocator);
      if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
        convolutiondepthwise1d
                  (&local_c8,this_00,(Mat *)local_78.data,&local_118,_kernel_w,this->stride_w,
                   this->dilation_w,this->group,this->activation_type,
                   (Mat *)(this->activation_params).data,
                   (Option *)CONCAT44(_h,in_stack_fffffffffffffed8));
        iVar2 = 0;
      }
    }
    piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    flatten((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start + 2,&local_118,opt);
    iVar2 = -100;
    if ((local_118.data != (void *)0x0) && ((long)local_118.c * local_118.cstep != 0))
    goto LAB_004ff9c1;
  }
  piVar1 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        if (local_118.data != (void *)0x0) {
          free(local_118.data);
        }
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_004ffb1e:
  piVar1 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if ((Mat *)local_78.data != (Mat *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar2;
}

Assistant:

int ConvolutionDepthWise1D::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _kernel_w = _weight_data.w;
    const int _num_output = _weight_data.c;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, _kernel_w, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;

    top_blob.create(outw, _num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolutiondepthwise1d(bottom_blob_bordered, top_blob, weight_data_flattened, bias_data_flattened, _kernel_w, stride_w, dilation_w, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}